

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O0

MemoryLeakDetectorNode * __thiscall
MemoryLeakDetectorList::removeNode(MemoryLeakDetectorList *this,char *memory)

{
  MemoryLeakDetectorNode *prev;
  MemoryLeakDetectorNode *cur;
  char *memory_local;
  MemoryLeakDetectorList *this_local;
  
  cur = this->head_;
  prev = (MemoryLeakDetectorNode *)0x0;
  while( true ) {
    if (cur == (MemoryLeakDetectorNode *)0x0) {
      return (MemoryLeakDetectorNode *)0x0;
    }
    if (*(char **)(cur + 0x10) == memory) break;
    prev = cur;
    cur = *(MemoryLeakDetectorNode **)(cur + 0x38);
  }
  if (prev != (MemoryLeakDetectorNode *)0x0) {
    *(undefined8 *)(prev + 0x38) = *(undefined8 *)(cur + 0x38);
    return cur;
  }
  this->head_ = *(MemoryLeakDetectorNode **)(cur + 0x38);
  return cur;
}

Assistant:

MemoryLeakDetectorNode* MemoryLeakDetectorList::removeNode(char* memory)
{
    MemoryLeakDetectorNode* cur = head_;
    MemoryLeakDetectorNode* prev = NULLPTR;
    while (cur) {
        if (cur->memory_ == memory) {
            if (prev) {
                prev->next_ = cur->next_;
                return cur;
            }
            else {
                head_ = cur->next_;
                return cur;
            }
        }
        prev = cur;
        cur = cur->next_;
    }
    return NULLPTR;
}